

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# title.c
# Opt level: O3

int title_screen(void)

{
  ALLEGRO_FONT *pAVar1;
  int iVar2;
  int iVar3;
  ALLEGRO_BITMAP *pAVar4;
  ALLEGRO_BITMAP *sprite;
  undefined8 uVar5;
  int64_t iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint y;
  bool bVar12;
  ALLEGRO_COLOR AVar13;
  ALLEGRO_COLOR AVar14;
  
  iVar2 = al_get_display_width(screen);
  iVar3 = al_get_display_height(screen);
  AVar13 = makecol(0xff,0xff,0xff);
  pAVar4 = create_memory_bitmap(iVar2,iVar3);
  al_set_target_bitmap();
  uVar7 = 0;
  al_set_blender(0,1,0);
  uVar9 = iVar3 / 2;
  if (1 < iVar3) {
    y = 0;
    iVar10 = iVar3;
    do {
      iVar10 = iVar10 + -1;
      AVar14 = makecol(0,0,uVar7 / uVar9);
      hline(0,y,iVar2,AVar14);
      AVar14 = makecol(0,0,uVar7 / uVar9);
      hline(0,iVar10,iVar2,AVar14);
      y = y + 1;
      uVar7 = uVar7 + 0xff;
    } while (uVar9 != y);
  }
  solid_mode();
  sprite = create_memory_bitmap(0x28,8);
  al_set_target_bitmap();
  al_map_rgba(0,0,0);
  al_clear_to_color();
  pAVar1 = font;
  AVar14 = makecol(0,0,0);
  textout(pAVar1,"SPEED",0,0,AVar14);
  iVar10 = iVar2 + 0x7f;
  if (-1 < iVar2) {
    iVar10 = iVar2;
  }
  iVar11 = iVar3 >> 0x1f;
  iVar8 = iVar3 / 0x18 + iVar11;
  stretch_sprite(pAVar4,sprite,(iVar10 >> 7) + 8,(iVar8 - iVar11) + 8,iVar2,iVar3);
  pAVar1 = font;
  AVar14 = makecol(0,0,0x40);
  textout(pAVar1,"SPEED",0,0,AVar14);
  stretch_sprite(pAVar4,sprite,iVar10 >> 7,iVar8 - iVar11,iVar2,iVar3);
  al_set_target_bitmap(pAVar4);
  al_destroy_bitmap(sprite);
  iVar10 = iVar2 / 2;
  textout_shadow("Simultaneous Projections",iVar10,uVar9 - 0x50,AVar13);
  textout_shadow("Employing an Ensemble of Displays",iVar10,uVar9 - 0x40,AVar13);
  textout_shadow("Or alternatively: Stupid Pointless",iVar10,uVar9 - 0x20,AVar13);
  textout_shadow("Effort at Establishing a Dumb Acronym",iVar10,uVar9 - 0x10,AVar13);
  textout_shadow("By Shawn Hargreaves, 1999",iVar10,uVar9 + 0x10,AVar13);
  textout_shadow("Written for the Allegro",iVar10,uVar9 + 0x30,AVar13);
  textout_shadow("SpeedHack competition",iVar10,uVar9 + 0x40,AVar13);
  uVar5 = al_get_backbuffer(screen);
  al_set_target_bitmap(uVar5);
  pAVar4 = replace_bitmap(pAVar4);
  start_retrace_count();
  iVar10 = iVar3 + 0xf;
  if (-1 < iVar3) {
    iVar10 = iVar3;
  }
  if (-0x10 < iVar3) {
    iVar3 = 0;
    do {
      iVar8 = 0;
      AVar13 = makecol(0,0,0);
      al_clear_to_color(AVar13.r,AVar13.b);
      iVar11 = 0x11;
      do {
        al_draw_bitmap_region(0,(float)iVar8,(float)iVar2,(float)iVar3,0,(float)iVar8);
        iVar8 = iVar8 + (iVar10 >> 4);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      al_flip_display();
      do {
        poll_input_wait();
        iVar6 = retrace_count();
      } while (iVar6 < (iVar3 << 10) / iVar2);
      bVar12 = iVar3 != iVar10 >> 4;
      iVar3 = iVar3 + 1;
    } while (bVar12);
  }
  stop_retrace_count();
  while ((((joy_b1 != 0 || (key[0x4b] != 0)) || (key[0x43] != 0)) ||
         (iVar2 = 0, iVar3 = 0, iVar10 = 0, key[0x3b] != 0))) {
    poll_input_wait();
  }
  while( true ) {
    joy_b1 = iVar10;
    key[0x4b] = iVar3;
    key[0x43] = iVar2;
    poll_input_wait();
    al_draw_bitmap(0,0,pAVar4,0);
    al_flip_display();
    if ((key[0x4b] != 0) || (key[0x43] != 0)) break;
    if ((key[0x3b] != 0) || (iVar2 = key[0x43], iVar3 = key[0x4b], iVar10 = joy_b1, joy_b1 != 0))
    break;
  }
  al_destroy_bitmap(pAVar4);
  iVar2 = 0;
  if (key[0x3b] == 0) {
    sfx_ping(2);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int title_screen()
{
   int SCREEN_W = al_get_display_width(screen);
   int SCREEN_H = al_get_display_height(screen);
   ALLEGRO_BITMAP *bmp, *b;
   ALLEGRO_COLOR white = makecol(255, 255, 255);
   int i, j, y;

   bmp = create_memory_bitmap(SCREEN_W, SCREEN_H);
   al_set_target_bitmap(bmp);
   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);

   for (i=0; i<SCREEN_H/2; i++) {
      hline(0, i, SCREEN_W, makecol(0, 0, i*255/(SCREEN_H/2)));
      hline(0, SCREEN_H-i-1, SCREEN_W, makecol(0, 0, i*255/(SCREEN_H/2)));
   }

   solid_mode();

   b = create_memory_bitmap(40, 8);
   al_set_target_bitmap(b);
   al_clear_to_color(al_map_rgba(0, 0, 0, 0));

   textout(font, "SPEED", 0, 0, makecol(0, 0, 0));
   stretch_sprite(bmp, b, SCREEN_W/128+8, SCREEN_H/24+8, SCREEN_W, SCREEN_H);

   textout(font, "SPEED", 0, 0, makecol(0, 0, 64));
   stretch_sprite(bmp, b, SCREEN_W/128, SCREEN_H/24, SCREEN_W, SCREEN_H);

   al_set_target_bitmap(bmp);

   al_destroy_bitmap(b);

   textout_shadow("Simultaneous Projections", SCREEN_W/2, SCREEN_H/2-80, white);
   textout_shadow("Employing an Ensemble of Displays", SCREEN_W/2, SCREEN_H/2-64, white);

   textout_shadow("Or alternatively: Stupid Pointless", SCREEN_W/2, SCREEN_H/2-32, white);
   textout_shadow("Effort at Establishing a Dumb Acronym", SCREEN_W/2, SCREEN_H/2-16, white);

   textout_shadow("By Shawn Hargreaves, 1999", SCREEN_W/2, SCREEN_H/2+16, white);
   textout_shadow("Written for the Allegro", SCREEN_W/2, SCREEN_H/2+48, white);
   textout_shadow("SpeedHack competition", SCREEN_W/2, SCREEN_H/2+64, white);

   al_set_target_bitmap(al_get_backbuffer(screen));

   bmp = replace_bitmap(bmp);

   start_retrace_count();

   for (i=0; i<=SCREEN_H/16; i++) {
      al_clear_to_color(makecol(0, 0, 0));

      for (j=0; j<=16; j++) {
	 y = j*(SCREEN_H/16);
	 al_draw_bitmap_region(bmp, 0, y, SCREEN_W, i, 0, y, 0);
      }

      al_flip_display();

      do {
	 poll_input_wait();
      } while (retrace_count() < i*1024/SCREEN_W);
   }

   stop_retrace_count();

   while (joy_b1 || key[ALLEGRO_KEY_SPACE] || key[ALLEGRO_KEY_ENTER] || key[ALLEGRO_KEY_ESCAPE])
      poll_input_wait();

   while (!key[ALLEGRO_KEY_SPACE] && !key[ALLEGRO_KEY_ENTER] && !key[ALLEGRO_KEY_ESCAPE] && !joy_b1) {
      poll_input_wait();
      al_draw_bitmap(bmp, 0, 0, 0);
      al_flip_display();
   }

   al_destroy_bitmap(bmp);

   if (key[ALLEGRO_KEY_ESCAPE])
      return FALSE;

   sfx_ping(2);

   return TRUE;
}